

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  nk_style_item_data *pnVar1;
  byte *pbVar2;
  float fVar3;
  nk_vec2 nVar4;
  nk_panel *pnVar5;
  nk_window *pnVar6;
  nk_vec2 nVar7;
  nk_rect r;
  nk_handle *f;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  nk_style_window *pnVar12;
  nk_command_buffer *b;
  nk_color c;
  float fVar13;
  float fVar14;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar16 [16];
  undefined1 auVar18 [12];
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  nk_rect nVar22;
  nk_rect rect;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect b_00;
  nk_rect rect_01;
  nk_flags ws;
  nk_vec2 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  nk_context *local_a0;
  undefined1 local_98 [16];
  nk_command_buffer *local_88;
  nk_handle *local_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  nk_rect clip;
  undefined8 uVar15;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ca5,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ca6,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  pnVar5 = ctx->current->layout;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3ca7,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  nk_zero(pnVar5,0x1c0);
  pnVar6 = ctx->current;
  uVar9 = pnVar6->flags;
  if ((uVar9 & 0x6000) == 0) {
    local_80 = &((ctx->style).font)->userdata;
    pnVar5 = pnVar6->layout;
    local_a0 = (nk_context *)0x0;
    if ((uVar9 >> 10 & 1) == 0) {
      local_a0 = ctx;
    }
    local_98._0_4_ = (ctx->style).window.scrollbar_size.x;
    local_b8._0_4_ = (ctx->style).window.scrollbar_size.y;
    local_c8 = nk_panel_get_padding(&ctx->style,panel_type);
    fVar19 = local_c8.y;
    uStack_c0 = extraout_XMM0_Qb;
    if ((uVar9 & 0x1002) == 2) {
      local_78._0_4_ = (pnVar6->bounds).x;
      local_78._4_4_ = (pnVar6->bounds).y;
      if ((title != (char *)0x0) && ((uVar9 & 0x58) != 0)) {
        fVar19 = (ctx->style).window.header.padding.y;
        fVar21 = (ctx->style).window.header.label_padding.y;
        fVar19 = fVar21 + fVar21 + fVar19 + fVar19 + *(float *)(local_80 + 1);
      }
      local_88 = (nk_command_buffer *)
                 CONCAT44(local_88._4_4_,(local_a0->input).mouse.buttons[0].clicked);
      iVar10 = (local_a0->input).mouse.buttons[0].down;
      _fStack_70 = 0;
      nVar22.h = fVar19;
      nVar22.w = (pnVar6->bounds).w;
      nVar22.x = (float)local_78._0_4_;
      nVar22.y = (float)local_78._4_4_;
      iVar8 = nk_input_has_mouse_click_down_in_rect(&local_a0->input,NK_BUTTON_LEFT,nVar22,1);
      if (((iVar10 != 0) && (iVar8 != 0)) && ((int)local_88 == 0)) {
        nVar4 = (local_a0->input).mouse.delta;
        fVar19 = nVar4.x;
        fVar21 = nVar4.y;
        (pnVar6->bounds).x = (float)local_78._0_4_ + fVar19;
        (pnVar6->bounds).y = (float)local_78._4_4_ + fVar21;
        nVar4 = (local_a0->input).mouse.buttons[0].clicked_pos;
        nVar7.y = nVar4.y + fVar21;
        nVar7.x = nVar4.x + fVar19;
        (local_a0->input).mouse.buttons[0].clicked_pos = nVar7;
        (ctx->style).cursor_active = (ctx->style).cursors[2];
      }
    }
    pnVar5->type = panel_type;
    pnVar5->flags = uVar9;
    fVar19 = (pnVar6->bounds).y;
    fVar21 = (pnVar6->bounds).w;
    fVar20 = (pnVar6->bounds).h;
    (pnVar5->bounds).x = (pnVar6->bounds).x;
    (pnVar5->bounds).y = fVar19;
    (pnVar5->bounds).w = fVar21;
    (pnVar5->bounds).h = fVar20;
    fVar19 = (pnVar5->bounds).x + local_c8.x;
    (pnVar5->bounds).x = fVar19;
    (pnVar5->bounds).w = (pnVar5->bounds).w - (local_c8.x + local_c8.x);
    if ((pnVar6->flags & 1) == 0) {
      pnVar5->border = 0.0;
      uVar15 = CONCAT44((pnVar5->bounds).y,fVar19);
    }
    else {
      if (panel_type == NK_PANEL_MENU) {
        lVar11 = 0x1e74;
      }
      else if (panel_type == NK_PANEL_POPUP) {
        lVar11 = 0x1e80;
      }
      else if (panel_type == NK_PANEL_CONTEXTUAL) {
        lVar11 = 0x1e70;
      }
      else if (panel_type == NK_PANEL_COMBO) {
        lVar11 = 0x1e6c;
      }
      else {
        lVar11 = 0x1e68;
        if (panel_type == NK_PANEL_GROUP) {
          lVar11 = 0x1e78;
        }
      }
      fVar19 = *(float *)((long)&(ctx->input).keyboard.keys[0].down + lVar11);
      pnVar5->border = fVar19;
      nVar22 = nk_shrink_rect(pnVar5->bounds,fVar19);
      uVar15 = nVar22._0_8_;
      pnVar5->bounds = nVar22;
    }
    pnVar5->at_x = (float)(int)uVar15;
    pnVar5->at_y = (float)(int)((ulong)uVar15 >> 0x20);
    pnVar5->max_x = 0.0;
    pnVar5->footer_height = 0.0;
    pnVar5->header_height = 0.0;
    nk_layout_reset_min_row_height(ctx);
    (pnVar5->row).index = 0;
    (pnVar5->row).columns = 0;
    (pnVar5->row).ratio = (float *)0x0;
    (pnVar5->row).item_width = 0.0;
    (pnVar5->row).tree_depth = 0;
    (pnVar5->row).height = local_c8.y;
    pnVar5->has_scrolling = 1;
    uVar9 = pnVar6->flags;
    if ((uVar9 & 0x20) == 0) {
      (pnVar5->bounds).w = (pnVar5->bounds).w - (float)local_98._0_4_;
    }
    if ((panel_type & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)) ==
        NK_PANEL_NONE) {
      fVar19 = 0.0;
      if ((uVar9 & 0x24) != 0x20) {
        fVar19 = (float)local_b8._0_4_;
      }
      pnVar5->footer_height = fVar19;
      (pnVar5->bounds).h = (pnVar5->bounds).h - fVar19;
      uVar9 = pnVar6->flags;
    }
    b = &pnVar6->buffer;
    if (((title != (char *)0x0) && ((uVar9 & 0x58) != 0)) && ((uVar9 & 0x2000) == 0)) {
      local_c8.x = (pnVar6->bounds).x;
      local_c8.y = (pnVar6->bounds).y;
      local_b8._0_4_ = (pnVar6->bounds).w;
      fVar19 = (ctx->style).window.header.padding.y;
      fVar21 = (ctx->style).window.header.label_padding.y;
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
      local_98._0_4_ = fVar21 + fVar21 + fVar19 + fVar19 + *(float *)(local_80 + 1);
      _local_78 = ZEXT416((uint)local_b8._0_4_);
      uStack_b0 = 0;
      uStack_ac = 0;
      pnVar5->header_height = (float)local_98._0_4_;
      (pnVar5->bounds).y = (pnVar5->bounds).y + (float)local_98._0_4_;
      (pnVar5->bounds).h = (pnVar5->bounds).h - (float)local_98._0_4_;
      pnVar5->at_y = pnVar5->at_y + (float)local_98._0_4_;
      uStack_c0._0_4_ = 0;
      uStack_c0._4_4_ = 0;
      if (ctx->active == pnVar6) {
        pnVar12 = (nk_style_window *)&(ctx->style).window.header.active;
        clip.h = *(float *)&(ctx->style).window.header.label_active;
      }
      else {
        local_b8._4_4_ = local_98._0_4_;
        _uStack_b0 = 0;
        rect.h = (float)local_98._0_4_;
        rect.w = (float)local_b8._0_4_;
        rect.x = local_c8.x;
        rect.y = local_c8.y;
        local_98 = ZEXT416((uint)local_98._0_4_);
        iVar10 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
        if (iVar10 == 0) {
          pnVar12 = &(ctx->style).window;
          clip.h = *(float *)&(ctx->style).window.header.label_normal;
        }
        else {
          pnVar12 = (nk_style_window *)&(ctx->style).window.header.hover;
          clip.h = *(float *)&(ctx->style).window.header.label_hover;
        }
      }
      local_98._0_4_ = (float)local_98._0_4_ + 1.0;
      pnVar1 = &(pnVar12->header).normal.data;
      local_b8._4_4_ = local_98._0_4_;
      if ((pnVar12->header).normal.type == NK_STYLE_ITEM_IMAGE) {
        r_00.h = (float)local_98._0_4_;
        r_00.w = (float)local_b8._0_4_;
        r_00.x = local_c8.x;
        r_00.y = local_c8.y;
        nk_draw_image(b,r_00,&pnVar1->image,(nk_color)0xffffffff);
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = '\0';
      }
      else {
        c = pnVar1->color;
        rect_00.h = (float)local_98._0_4_;
        rect_00.w = (float)local_b8._0_4_;
        rect_00.x = local_c8.x;
        rect_00.y = local_c8.y;
        nk_fill_rect(b,rect_00,0.0,c);
      }
      fVar19 = (ctx->style).window.header.padding.y;
      fVar21 = local_c8.y + fVar19;
      fVar20 = (float)local_98._0_4_ - (fVar19 + fVar19);
      uVar9 = pnVar6->flags;
      fVar19 = fVar20;
      clip.w = (float)c;
      if ((uVar9 & 8) != 0) {
        ws = 0;
        local_98._0_4_ = fVar20;
        if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
          fVar19 = (ctx->style).window.header.padding.x;
          fVar13 = (local_c8.x + (float)local_78._0_4_) - (fVar20 + fVar19);
          local_b8._0_4_ =
               (float)local_78._0_4_ - ((ctx->style).window.header.spacing.x + fVar20 + fVar19);
        }
        else {
          fVar19 = (ctx->style).window.header.padding.x;
          fVar13 = local_c8.x + fVar19;
          local_c8.x = local_c8.x + (ctx->style).window.header.spacing.x + fVar20 + fVar19;
        }
        local_78._4_4_ = fVar21;
        local_78._0_4_ = fVar13;
        fStack_70 = fVar21;
        fStack_6c = fVar21;
        bounds.y = fVar21;
        bounds.x = fVar13;
        bounds.h = fVar20;
        bounds.w = fVar20;
        iVar10 = nk_do_button_symbol(&ws,b,bounds,(ctx->style).window.header.close_symbol,
                                     NK_BUTTON_DEFAULT,&(ctx->style).window.header.close_button,
                                     &local_a0->input,(ctx->style).font);
        uVar9 = pnVar6->flags;
        if ((uVar9 >> 0xc & 1) == 0 && iVar10 != 0) {
          pnVar5->flags = pnVar5->flags & 0xffff5fff | 0x2000;
        }
        fVar19 = (float)local_98._0_4_;
        fVar21 = (float)local_78._4_4_;
      }
      local_88 = b;
      if ((uVar9 & 0x10) == 0) {
      }
      else {
        ws = 0;
        fVar13 = local_b8._0_4_;
        if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
          fVar14 = (fVar13 + local_c8.x) - fVar19;
          if ((uVar9 & 8) == 0) {
            fVar3 = (ctx->style).window.header.padding.x;
            fVar14 = fVar14 - fVar3;
            auVar16._0_8_ = local_b8._4_8_ << 0x20;
            auVar16._8_4_ = local_b8._8_4_;
            auVar16._12_4_ = local_b8._12_4_;
            fVar13 = fVar13 - fVar3;
            auVar18 = auVar16._4_12_;
          }
          else {
            auVar17._0_8_ = local_b8._4_8_ << 0x20;
            auVar17._8_4_ = local_b8._8_4_;
            auVar17._12_4_ = local_b8._12_4_;
            auVar18 = auVar17._4_12_;
          }
          register0x00001204 = auVar18;
          local_b8._0_4_ = fVar13 - (fVar19 + (ctx->style).window.header.spacing.x);
          fVar19 = local_c8.x;
        }
        else {
          fVar19 = local_c8.x +
                   fVar19 + (ctx->style).window.header.spacing.x +
                   (ctx->style).window.header.padding.x;
          fVar14 = local_c8.x;
        }
        local_c8.x = fVar19;
        bounds_00.y = fVar21;
        bounds_00.x = fVar14;
        bounds_00.h = fVar20;
        bounds_00.w = fVar20;
        iVar10 = nk_do_button_symbol(&ws,b,bounds_00,
                                     (&(ctx->style).window.header.minimize_symbol)
                                     [(ushort)((ushort)pnVar5->flags >> 0xf)],NK_BUTTON_DEFAULT,
                                     &(ctx->style).window.header.minimize_button,&local_a0->input,
                                     (ctx->style).font);
        if ((iVar10 != 0) && ((pnVar6->flags & 0x1000) == 0)) {
          pbVar2 = (byte *)((long)&pnVar5->flags + 1);
          *pbVar2 = *pbVar2 ^ 0x80;
        }
      }
      iVar10 = nk_strlen(title);
      f = local_80;
      fVar21 = (*(code *)local_80[2])(*local_80,(float)local_80[1].id,title,iVar10);
      b = local_88;
      clip.x = 0.0;
      clip.y = 0.0;
      nVar4 = (ctx->style).window.header.label_padding;
      fVar20 = nVar4.y;
      fVar13 = local_c8.x + (ctx->style).window.header.padding.x + nVar4.x;
      fVar19 = (ctx->style).window.header.spacing.x;
      fVar21 = fVar19 + fVar19 + fVar21;
      fVar19 = ((float)local_b8._0_4_ + local_c8.x) - fVar13;
      if (fVar19 <= fVar21) {
        fVar21 = fVar19;
      }
      fVar19 = 0.0;
      if (0.0 <= fVar21) {
        fVar19 = fVar21;
      }
      b_00.y = local_c8.y + fVar20;
      b_00.x = fVar13;
      b_00.h = fVar20 + fVar20 + *(float *)(f + 1);
      b_00.w = fVar19;
      nk_widget_text(local_88,b_00,title,iVar10,(nk_text *)&clip,0x11,(nk_user_font *)f);
    }
    if ((pnVar5->flags & 0x8800) == 0) {
      fVar20 = (pnVar6->bounds).y + pnVar5->header_height;
      fVar19 = (pnVar6->bounds).x;
      fVar21 = (pnVar6->bounds).w;
      fVar13 = (pnVar6->bounds).h - pnVar5->header_height;
      pnVar1 = &(ctx->style).window.fixed_background.data;
      if ((ctx->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(b,(nk_rect)CONCAT88(CONCAT44(fVar13,fVar21),CONCAT44(fVar20,fVar19)),
                      &pnVar1->image,(nk_color)0xffffffff);
      }
      else {
        rect_01.h = fVar13;
        rect_01.w = fVar21;
        rect_01.x = fVar19;
        rect_01.y = fVar20;
        nk_fill_rect(b,rect_01,0.0,pnVar1->color);
      }
    }
    fVar19 = (pnVar5->bounds).y;
    fVar21 = (pnVar5->bounds).w;
    fVar20 = (pnVar5->bounds).h;
    (pnVar5->clip).x = (pnVar5->bounds).x;
    (pnVar5->clip).y = fVar19;
    (pnVar5->clip).w = fVar21;
    (pnVar5->clip).h = fVar20;
    fVar19 = (pnVar5->clip).x;
    fVar21 = (pnVar5->clip).y;
    nk_unify(&clip,&(pnVar6->buffer).clip,fVar19,fVar21,(pnVar5->clip).w + fVar19,
             (pnVar5->clip).h + fVar21);
    r.w = clip.w;
    r.x = clip.x;
    r.y = clip.y;
    r.h = clip.h;
    nk_push_scissor(b,r);
    (pnVar5->clip).x = clip.x;
    (pnVar5->clip).y = clip.y;
    (pnVar5->clip).w = clip.w;
    (pnVar5->clip).h = clip.h;
    uVar9 = (uint)(-1 < (short)pnVar5->flags);
    if ((pnVar5->flags >> 0xd & 1) != 0) {
      uVar9 = 0;
    }
  }
  else {
    nk_zero(pnVar6->layout,0x1c0);
    ctx->current->layout->type = panel_type;
    uVar9 = 0;
  }
  return uVar9;
}

Assistant:

NK_LIB int
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
    struct nk_input *in;
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_command_buffer *out;
    const struct nk_style *style;
    const struct nk_user_font *font;

    struct nk_vec2 scrollbar_size;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
    if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
        nk_zero(ctx->current->layout, sizeof(struct nk_panel));
        ctx->current->layout->type = panel_type;
        return 0;
    }
    /* pull state into local stack */
    style = &ctx->style;
    font = style->font;
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    win->buffer.userdata = ctx->userdata;
#endif
    /* pull style configuration into local stack */
    scrollbar_size = style->window.scrollbar_size;
    panel_padding = nk_panel_get_padding(style, panel_type);

    /* window movement */
    if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
        int left_mouse_down;
        int left_mouse_clicked;
        int left_mouse_click_in_cursor;

        /* calculate draggable window space */
        struct nk_rect header;
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        if (nk_panel_has_header(win->flags, title)) {
            header.h = font->height + 2.0f * style->window.header.padding.y;
            header.h += 2.0f * style->window.header.label_padding.y;
        } else header.h = panel_padding.y;

        /* window movement by dragging */
        left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
        left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
        left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
            NK_BUTTON_LEFT, header, nk_true);
        if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
            win->bounds.x = win->bounds.x + in->mouse.delta.x;
            win->bounds.y = win->bounds.y + in->mouse.delta.y;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
            ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
        }
    }

    /* setup panel */
    layout->type = panel_type;
    layout->flags = win->flags;
    layout->bounds = win->bounds;
    layout->bounds.x += panel_padding.x;
    layout->bounds.w -= 2*panel_padding.x;
    if (win->flags & NK_WINDOW_BORDER) {
        layout->border = nk_panel_get_border(style, win->flags, panel_type);
        layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
    } else layout->border = 0;
    layout->at_y = layout->bounds.y;
    layout->at_x = layout->bounds.x;
    layout->max_x = 0;
    layout->header_height = 0;
    layout->footer_height = 0;
    nk_layout_reset_min_row_height(ctx);
    layout->row.index = 0;
    layout->row.columns = 0;
    layout->row.ratio = 0;
    layout->row.item_width = 0;
    layout->row.tree_depth = 0;
    layout->row.height = panel_padding.y;
    layout->has_scrolling = nk_true;
    if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
        layout->bounds.w -= scrollbar_size.x;
    if (!nk_panel_is_nonblock(panel_type)) {
        layout->footer_height = 0;
        if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
            layout->footer_height = scrollbar_size.y;
        layout->bounds.h -= layout->footer_height;
    }

    /* panel header */
    if (nk_panel_has_header(win->flags, title))
    {
        struct nk_text text;
        struct nk_rect header;
        const struct nk_style_item *background = 0;

        /* calculate header bounds */
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        header.h = font->height + 2.0f * style->window.header.padding.y;
        header.h += (2.0f * style->window.header.label_padding.y);

        /* shrink panel by header */
        layout->header_height = header.h;
        layout->bounds.y += header.h;
        layout->bounds.h -= header.h;
        layout->at_y += header.h;

        /* select correct header background and text color */
        if (ctx->active == win) {
            background = &style->window.header.active;
            text.text = style->window.header.label_active;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
            background = &style->window.header.hover;
            text.text = style->window.header.label_hover;
        } else {
            background = &style->window.header.normal;
            text.text = style->window.header.label_normal;
        }

        /* draw header background */
        header.h += 1.0f;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            text.background = nk_rgba(0,0,0,0);
            nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, background->data.color);
        }

        /* window close button */
        {struct nk_rect button;
        button.y = header.y + style->window.header.padding.y;
        button.h = header.h - 2 * style->window.header.padding.y;
        button.w = button.h;
        if (win->flags & NK_WINDOW_CLOSABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
                header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
            } else {
                button.x = header.x + style->window.header.padding.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }

            if (nk_do_button_symbol(&ws, &win->buffer, button,
                style->window.header.close_symbol, NK_BUTTON_DEFAULT,
                &style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
            {
                layout->flags |= NK_WINDOW_HIDDEN;
                layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
            }
        }

        /* window minimize button */
        if (win->flags & NK_WINDOW_MINIMIZABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - button.w;
                if (!(win->flags & NK_WINDOW_CLOSABLE)) {
                    button.x -= style->window.header.padding.x;
                    header.w -= style->window.header.padding.x;
                }
                header.w -= button.w + style->window.header.spacing.x;
            } else {
                button.x = header.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }
            if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
                style->window.header.maximize_symbol: style->window.header.minimize_symbol,
                NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
                layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
                    layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
                    layout->flags | NK_WINDOW_MINIMIZED;
        }}

        {/* window header title */
        int text_len = nk_strlen(title);
        struct nk_rect label = {0,0,0,0};
        float t = font->width(font->userdata, font->height, title, text_len);
        text.padding = nk_vec2(0,0);

        label.x = header.x + style->window.header.padding.x;
        label.x += style->window.header.label_padding.x;
        label.y = header.y + style->window.header.label_padding.y;
        label.h = font->height + 2 * style->window.header.label_padding.y;
        label.w = t + 2 * style->window.header.spacing.x;
        label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
        nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
    }

    /* draw window background */
    if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
        struct nk_rect body;
        body.x = win->bounds.x;
        body.w = win->bounds.w;
        body.y = (win->bounds.y + layout->header_height);
        body.h = (win->bounds.h - layout->header_height);
        if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
            nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
        else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
    }

    /* set clipping rectangle */
    {struct nk_rect clip;
    layout->clip = layout->bounds;
    nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
        layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
    nk_push_scissor(out, clip);
    layout->clip = clip;}
    return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}